

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skynet_handle.c
# Opt level: O0

void skynet_handle_init(int harbor)

{
  handle_storage *lock;
  skynet_context **ppsVar1;
  handle_name *phVar2;
  handle_storage *s;
  int harbor_local;
  
  if (H == (handle_storage *)0x0) {
    lock = (handle_storage *)malloc(0x30);
    lock->slot_size = 4;
    ppsVar1 = (skynet_context **)malloc((long)lock->slot_size << 3);
    lock->slot = ppsVar1;
    memset(lock->slot,0,(long)lock->slot_size << 3);
    rwlock_init((rwlock *)lock);
    lock->harbor = harbor << 0x18;
    lock->handle_index = 1;
    lock->name_cap = 2;
    lock->name_count = 0;
    phVar2 = (handle_name *)malloc((long)lock->name_cap << 4);
    lock->name = phVar2;
    H = lock;
    return;
  }
  __assert_fail("H==NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/microcai[P]skynet/skynet-src/skynet_handle.c"
                ,0xf4,"void skynet_handle_init(int)");
}

Assistant:

void 
skynet_handle_init(int harbor) {
	assert(H==NULL);
	struct handle_storage * s = skynet_malloc(sizeof(*H));
	s->slot_size = DEFAULT_SLOT_SIZE;
	s->slot = skynet_malloc(s->slot_size * sizeof(struct skynet_context *));
	memset(s->slot, 0, s->slot_size * sizeof(struct skynet_context *));

	rwlock_init(&s->lock);
	// reserve 0 for system
	s->harbor = (uint32_t) (harbor & 0xff) << HANDLE_REMOTE_SHIFT;
	s->handle_index = 1;
	s->name_cap = 2;
	s->name_count = 0;
	s->name = skynet_malloc(s->name_cap * sizeof(struct handle_name));

	H = s;

	// Don't need to free H
}